

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsu.c
# Opt level: O3

void device_reset_vsu(void *info)

{
  long lVar1;
  vsu_state *chip;
  
  *(undefined1 *)((long)info + 0x38) = 0;
  *(undefined4 *)((long)info + 0x194) = 0;
  *(undefined4 *)((long)info + 0x1e0) = 1;
  *(undefined8 *)((long)info + 8) = 0;
  *(undefined8 *)((long)info + 0x10) = 0;
  *(undefined8 *)((long)info + 0x18) = 0;
  *(undefined8 *)((long)info + 0x20) = 0;
  *(undefined8 *)((long)info + 0x28) = 0;
  *(undefined8 *)((long)info + 0x30) = 0;
  *(undefined8 *)((long)info + 0xfc) = 0;
  *(undefined8 *)((long)info + 0x104) = 0;
  *(undefined8 *)((long)info + 0x10c) = 0;
  *(undefined8 *)((long)info + 0x114) = 0;
  *(undefined8 *)((long)info + 0x11c) = 0;
  *(undefined8 *)((long)info + 0x124) = 0;
  *(undefined8 *)((long)info + 0x12a) = 0;
  lVar1 = -0x18;
  do {
    *(undefined4 *)((long)info + lVar1 + 0x164) = 0;
    *(undefined4 *)((long)info + lVar1 + 0x17c) = 0;
    *(undefined4 *)((long)info + lVar1 + 0x194) = 0;
    *(undefined4 *)((long)info + lVar1 + 0x1b0) = 0x12c0;
    *(undefined4 *)((long)info + lVar1 + 0x1c8) = 4;
    *(undefined4 *)((long)info + lVar1 + 0x1e0) = 4;
    *(undefined4 *)((long)info + lVar1 + 0x14c) = 0x78;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0);
  *(undefined4 *)((long)info + 0x1e4) = 0x78;
  *(undefined1 *)((long)info + 0x1e8) = 0;
  *(undefined8 *)((long)info + 0x200) = 0;
  memset((void *)((long)info + 0x39),0,0xc0);
  return;
}

Assistant:

static void VSU_Power(vsu_state* chip)
{
	int ch;
	
	chip->SweepControl = 0;
	chip->SweepModCounter = 0;
	chip->SweepModClockDivider = 1;

	for(ch = 0; ch < 6; ch++)
	{
		chip->IntlControl[ch] = 0;
		chip->LeftLevel[ch] = 0;
		chip->RightLevel[ch] = 0;
		chip->Frequency[ch] = 0;
		chip->EnvControl[ch] = 0;
		chip->RAMAddress[ch] = 0;

		chip->EffFreq[ch] = 0;
		chip->Envelope[ch] = 0;
		chip->WavePos[ch] = 0;
		chip->FreqCounter[ch] = 0;
		chip->IntervalCounter[ch] = 0;
		chip->EnvelopeCounter[ch] = 0;

		chip->EffectsClockDivider[ch] = 4800;
		chip->IntervalClockDivider[ch] = 4;
		chip->EnvelopeClockDivider[ch] = 4;

		chip->LatcherClockDivider[ch] = 120;
	}


	chip->NoiseLatcherClockDivider = 120;
	chip->NoiseLatcher = 0;

	memset(chip->WaveData, 0, sizeof(chip->WaveData));
	memset(chip->ModData, 0, sizeof(chip->ModData));

	RC_RESET(&chip->cycleCntr);
}